

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

void __thiscall
IntrusiveList<VariableHandle>::push_back(IntrusiveList<VariableHandle> *this,VariableHandle *node)

{
  VariableHandle *node_local;
  IntrusiveList<VariableHandle> *this_local;
  
  if (node == (VariableHandle *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
  }
  if (node->next == (VariableHandle *)0x0) {
    if (((node->listed ^ 0xffU) & 1) == 0) {
      __assert_fail("!node->listed",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                    ,0x11,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]")
      ;
    }
    node->listed = true;
    if (this->head == (VariableHandle *)0x0) {
      this->tail = node;
      this->head = node;
    }
    else {
      this->tail->next = node;
      this->tail = node;
    }
    return;
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}